

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O0

void soul::buildProcessorInstances(ModuleBase *module,Module *m,StringDictionary *dictionary)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  pool_ref<soul::AST::ProcessorInstance> *ppVar3;
  ProcessorInstance *pPVar4;
  UnqualifiedName *this;
  ProcessorInstance *p;
  pool_ptr<soul::AST::Expression> local_1f8;
  Expression local_1f0;
  pool_ptr<soul::AST::Expression> local_1d8;
  Expression local_1d0;
  pool_ptr<soul::AST::Expression> local_1b8;
  Expression local_1b0;
  pool_ptr<soul::AST::Expression> local_198;
  Expression local_190;
  pool_ptr<soul::AST::Expression> local_178;
  Expression local_170;
  string local_158;
  string local_128;
  undefined1 local_108 [8];
  ProcessorInstance desc;
  pool_ref<soul::AST::ProcessorInstance> *i;
  pool_ref<soul::AST::ProcessorInstance> *__end1;
  pool_ref<soul::AST::ProcessorInstance> *__begin1;
  ArrayView<soul::pool_ref<soul::AST::ProcessorInstance>_> *local_28;
  ArrayView<soul::pool_ref<soul::AST::ProcessorInstance>_> *__range1;
  StringDictionary *dictionary_local;
  Module *m_local;
  ModuleBase *module_local;
  
  __range1 = (ArrayView<soul::pool_ref<soul::AST::ProcessorInstance>_> *)dictionary;
  dictionary_local = (StringDictionary *)m;
  m_local = (Module *)module;
  iVar2 = (*(module->super_Scope)._vptr_Scope[0x13])(&module->super_Scope);
  __begin1 = (pool_ref<soul::AST::ProcessorInstance> *)CONCAT44(extraout_var,iVar2);
  local_28 = (ArrayView<soul::pool_ref<soul::AST::ProcessorInstance>_> *)&__begin1;
  __end1 = ArrayView<soul::pool_ref<soul::AST::ProcessorInstance>_>::begin(local_28);
  ppVar3 = ArrayView<soul::pool_ref<soul::AST::ProcessorInstance>_>::end(local_28);
  for (; __end1 != ppVar3; __end1 = __end1 + 1) {
    desc.arraySize.sections.
    super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)__end1;
    pPVar4 = pool_ref<soul::AST::ProcessorInstance>::operator->(__end1);
    bVar1 = AST::ProcessorInstance::isImplicitlyCreated(pPVar4);
    if (!bVar1) {
      SourceCodeModel::ProcessorInstance::ProcessorInstance((ProcessorInstance *)local_108);
      pPVar4 = pool_ref<soul::AST::ProcessorInstance>::operator->
                         ((pool_ref<soul::AST::ProcessorInstance> *)
                          desc.arraySize.sections.
                          super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = pool_ptr<soul::AST::UnqualifiedName>::operator!=(&pPVar4->instanceName,(void *)0x0);
      if (bVar1) {
        pPVar4 = pool_ref::operator_cast_to_ProcessorInstance_
                           ((pool_ref *)
                            desc.arraySize.sections.
                            super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        makeUID_abi_cxx11_(&local_128,(soul *)pPVar4,p);
        std::__cxx11::string::operator=((string *)local_108,(string *)&local_128);
        std::__cxx11::string::~string((string *)&local_128);
      }
      pPVar4 = pool_ref<soul::AST::ProcessorInstance>::operator->
                         ((pool_ref<soul::AST::ProcessorInstance> *)
                          desc.arraySize.sections.
                          super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this = pool_ptr<soul::AST::UnqualifiedName>::operator->(&pPVar4->instanceName);
      AST::UnqualifiedName::toString_abi_cxx11_(&local_158,this);
      std::__cxx11::string::operator=
                ((string *)(desc.UID.field_2._M_local_buf + 8),(string *)&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      pPVar4 = pool_ref<soul::AST::ProcessorInstance>::operator->
                         ((pool_ref<soul::AST::ProcessorInstance> *)
                          desc.arraySize.sections.
                          super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_178.object = (pPVar4->targetProcessor).object;
      ExpressionHelpers::createIfNotNull(&local_170,&local_178,(StringDictionary *)__range1);
      SourceCodeModel::Expression::operator=
                ((Expression *)((long)&desc.name.field_2 + 8),&local_170);
      SourceCodeModel::Expression::~Expression(&local_170);
      pool_ptr<soul::AST::Expression>::~pool_ptr(&local_178);
      pPVar4 = pool_ref<soul::AST::ProcessorInstance>::operator->
                         ((pool_ref<soul::AST::ProcessorInstance> *)
                          desc.arraySize.sections.
                          super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_198.object = (pPVar4->specialisationArgs).object;
      ExpressionHelpers::createIfNotNull(&local_190,&local_198,(StringDictionary *)__range1);
      SourceCodeModel::Expression::operator=
                ((Expression *)
                 &desc.targetProcessor.sections.
                  super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_190);
      SourceCodeModel::Expression::~Expression(&local_190);
      pool_ptr<soul::AST::Expression>::~pool_ptr(&local_198);
      pPVar4 = pool_ref<soul::AST::ProcessorInstance>::operator->
                         ((pool_ref<soul::AST::ProcessorInstance> *)
                          desc.arraySize.sections.
                          super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_1b8.object = (pPVar4->clockMultiplierRatio).object;
      ExpressionHelpers::createIfNotNull(&local_1b0,&local_1b8,(StringDictionary *)__range1);
      SourceCodeModel::Expression::operator=
                ((Expression *)
                 &desc.specialisationArgs.sections.
                  super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1b0);
      SourceCodeModel::Expression::~Expression(&local_1b0);
      pool_ptr<soul::AST::Expression>::~pool_ptr(&local_1b8);
      pPVar4 = pool_ref<soul::AST::ProcessorInstance>::operator->
                         ((pool_ref<soul::AST::ProcessorInstance> *)
                          desc.arraySize.sections.
                          super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_1d8.object = (pPVar4->clockDividerRatio).object;
      ExpressionHelpers::createIfNotNull(&local_1d0,&local_1d8,(StringDictionary *)__range1);
      SourceCodeModel::Expression::operator=
                ((Expression *)
                 &desc.clockMultiplierRatio.sections.
                  super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1d0);
      SourceCodeModel::Expression::~Expression(&local_1d0);
      pool_ptr<soul::AST::Expression>::~pool_ptr(&local_1d8);
      pPVar4 = pool_ref<soul::AST::ProcessorInstance>::operator->
                         ((pool_ref<soul::AST::ProcessorInstance> *)
                          desc.arraySize.sections.
                          super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_1f8.object = (pPVar4->arraySize).object;
      ExpressionHelpers::createIfNotNull(&local_1f0,&local_1f8,(StringDictionary *)__range1);
      SourceCodeModel::Expression::operator=
                ((Expression *)
                 &desc.clockDividerRatio.sections.
                  super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1f0);
      SourceCodeModel::Expression::~Expression(&local_1f0);
      pool_ptr<soul::AST::Expression>::~pool_ptr(&local_1f8);
      std::
      vector<soul::SourceCodeModel::ProcessorInstance,_std::allocator<soul::SourceCodeModel::ProcessorInstance>_>
      ::push_back((vector<soul::SourceCodeModel::ProcessorInstance,_std::allocator<soul::SourceCodeModel::ProcessorInstance>_>
                   *)&dictionary_local[9].strings,(value_type *)local_108);
      SourceCodeModel::ProcessorInstance::~ProcessorInstance((ProcessorInstance *)local_108);
    }
  }
  return;
}

Assistant:

static void buildProcessorInstances (AST::ModuleBase& module, SourceCodeModel::Module& m, const StringDictionary& dictionary)
{
    for (auto& i : module.getProcessorInstances())
    {
        if (! i->isImplicitlyCreated())
        {
            SourceCodeModel::ProcessorInstance desc;

            if (i->instanceName != nullptr)
                desc.UID = makeUID (i);

            desc.name = i->instanceName->toString();
            desc.targetProcessor      = ExpressionHelpers::createIfNotNull (i->targetProcessor, dictionary);
            desc.specialisationArgs   = ExpressionHelpers::createIfNotNull (i->specialisationArgs, dictionary);
            desc.clockMultiplierRatio = ExpressionHelpers::createIfNotNull (i->clockMultiplierRatio, dictionary);
            desc.clockDividerRatio    = ExpressionHelpers::createIfNotNull (i->clockDividerRatio, dictionary);
            desc.arraySize            = ExpressionHelpers::createIfNotNull (i->arraySize, dictionary);

            m.processorInstances.push_back (std::move (desc));
        }
    }
}